

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ios_prop.h
# Opt level: O2

propery * booster::locale::impl::ios_prop<propery>::get(ios_base *ios)

{
  bool bVar1;
  int __ix;
  undefined8 in_RAX;
  void **ppvVar2;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  __ix = get_id();
  bVar1 = has(ios);
  if (!bVar1) {
    uStack_18 = CONCAT44(0xffffffff,(undefined4)uStack_18);
    counter = counter + 1;
    set((propery *)((long)&uStack_18 + 4),ios);
    counter = counter + -1;
  }
  ppvVar2 = std::ios_base::pword(ios,__ix);
  return (propery *)*ppvVar2;
}

Assistant:

static Property &get(std::ios_base &ios)
                {
                    int id=get_id();
                    if(!has(ios))
                        set(Property(),ios);
                    return *static_cast<Property *>(ios.pword(id));
                }